

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

bool WAsmJs::ShouldJitFunction(FunctionBody *body,uint interpretedCount)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  ScriptContext *this;
  ScriptConfiguration *this_00;
  bool local_31;
  uint maxAsmJsInterpretRunCount;
  uint minAsmJsInterpretRunCount;
  bool forceNative;
  uint interpretedCount_local;
  FunctionBody *body_local;
  
  uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
  LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,BackEndPhase,uVar2,LVar3);
  if (!bVar1) {
    uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
    LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FullJitPhase,uVar2,LVar3);
    if (!bVar1) {
      this = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
      this_00 = Js::ScriptContext::GetConfig(this);
      bVar1 = Js::ScriptConfiguration::IsNoNative(this_00);
      if ((!bVar1) && (bVar1 = Js::FunctionBody::GetIsAsmJsFullJitScheduled(body), !bVar1)) {
        bVar1 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,ForceNativeFlag);
        local_31 = true;
        if ((!bVar1) && (local_31 = true, interpretedCount < DAT_01eafd58)) {
          local_31 = DAT_01eafd68 <= interpretedCount;
        }
        return local_31;
      }
    }
  }
  return false;
}

Assistant:

bool ShouldJitFunction(Js::FunctionBody* body, uint interpretedCount)
    {
#if ENABLE_NATIVE_CODEGEN
        if (PHASE_OFF(Js::BackEndPhase, body) ||
            PHASE_OFF(Js::FullJitPhase, body) ||
            body->GetScriptContext()->GetConfig()->IsNoNative() ||
            body->GetIsAsmJsFullJitScheduled())
        {
            return false;
        }
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled() && !JITManager::GetJITManager()->IsConnected())
        {
            return false;
        }
#endif
        const bool forceNative = CONFIG_ISENABLED(Js::ForceNativeFlag);
        const uint minAsmJsInterpretRunCount = (uint)CONFIG_FLAG(MinAsmJsInterpreterRunCount);
        const uint maxAsmJsInterpretRunCount = (uint)CONFIG_FLAG(MaxAsmJsInterpreterRunCount);
        return forceNative || interpretedCount >= minAsmJsInterpretRunCount || interpretedCount >= maxAsmJsInterpretRunCount;
#else
        return false;
#endif
    }